

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  size_type *psVar1;
  Config *pCVar2;
  pointer pcVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  IStreamingReporter *p;
  ostream *poVar6;
  domain_error *this_00;
  Config *local_1e0;
  ostringstream oss;
  undefined1 local_1d0 [392];
  size_type *local_48;
  string reporterName;
  
  pCVar2 = (this->m_config).m_p;
  pcVar3 = (pCVar2->m_data).reporterName._M_dataplus._M_p;
  local_1e0 = (Config *)local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (pCVar2->m_data).reporterName._M_string_length);
  psVar1 = &reporterName._M_string_length;
  local_48 = psVar1;
  if (_oss == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"console","");
  }
  else {
    pCVar2 = (this->m_config).m_p;
    pcVar3 = (pCVar2->m_data).reporterName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,pcVar3 + (pCVar2->m_data).reporterName._M_string_length);
  }
  if (local_1e0 != (Config *)local_1d0) {
    operator_delete(local_1e0);
  }
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  local_1e0 = (this->m_config).m_p;
  if (local_1e0 != (Config *)0x0) {
    (*(local_1e0->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])();
  }
  p = (IStreamingReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar4),&local_48,&local_1e0);
  Ptr<Catch::IStreamingReporter>::operator=(&this->m_reporter,p);
  if (local_1e0 != (Config *)0x0) {
    (*(local_1e0->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  if ((this->m_reporter).m_p != (IStreamingReporter *)0x0) {
    if (local_48 != psVar1) {
      operator_delete(local_48);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1e0,"No reporter registered with name: \'",0x23);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1e0,(char *)local_48,(long)reporterName._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,(string *)(local_1d0 + 0x168));
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }